

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpHeaderBase.cpp
# Opt level: O3

ErrCode __thiscall HttpHeaderBase::getFieldInt64(HttpHeaderBase *this,FieldType type,int64_t *value)

{
  char *__nptr;
  ErrCode EVar1;
  longlong lVar2;
  long lVar3;
  
  EVar1 = kNotFound;
  if ((long)this->mNumFields < 1) {
    lVar2 = 0;
  }
  else {
    lVar2 = 0;
    lVar3 = 0;
    do {
      if (*(int *)((long)&this->mFields[0].mType + lVar3) == type) {
        __nptr = *(char **)((long)&this->mFields[0].mData + lVar3);
        lVar2 = 0;
        if (__nptr != (char *)0x0) {
          lVar2 = strtoll(__nptr,(char **)0x0,0);
          EVar1 = kNoError;
        }
        break;
      }
      lVar3 = lVar3 + 0x10;
    } while ((long)this->mNumFields * 0x10 != lVar3);
  }
  *value = lVar2;
  return EVar1;
}

Assistant:

ErrCode HttpHeaderBase::getFieldInt64(FieldMap::FieldType type,
									  int64_t &value) const
{
	const char *str = getField(type);
	
	if (str != NULL)
	{
		value = strtoll(str, NULL, 0);
		return kNoError;
	}
	
	value = 0;
	return kNotFound;
}